

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O3

void avro::assertType(Entity *e,EntityType et)

{
  Exception *this;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  EntityType local_110;
  EntityType local_10c;
  put_holder<char,_std::char_traits<char>_> local_108;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  
  if (e->type_ == et) {
    return;
  }
  local_110 = et;
  this = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_f0,"Unexpected type for default value: Expected %1%, but found %2%");
  local_108.arg = &local_110;
  local_108.put_head =
       boost::io::detail::call_put_head<char,std::char_traits<char>,avro::json::EntityType>;
  local_108.put_last =
       boost::io::detail::call_put_last<char,std::char_traits<char>,avro::json::EntityType>;
  pbVar1 = boost::io::detail::
           feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                     (&local_f0,&local_108);
  local_10c = e->type_;
  local_108.arg = &local_10c;
  local_108.put_head =
       boost::io::detail::call_put_head<char,std::char_traits<char>,avro::json::EntityType_const>;
  local_108.put_last =
       boost::io::detail::call_put_last<char,std::char_traits<char>,avro::json::EntityType_const>;
  pbVar1 = boost::io::detail::
           feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                     (pbVar1,&local_108);
  Exception::Exception(this,pbVar1);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

static void assertType(const Entity& e, EntityType et)
{
    if (e.type() != et) {
        throw Exception(boost::format("Unexpected type for default value: "
            "Expected %1%, but found %2%") % et % e.type());
    }
}